

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O3

bool __thiscall
pybind11::detail::object_api<pybind11::handle>::contains<pybind11::str&>
          (object_api<pybind11::handle> *this,str *item)

{
  enable_if_t<detail::move_if_unreferenced<bool>::value,_bool> eVar1;
  str local_40;
  undefined8 local_38;
  char *local_30;
  object local_28;
  object local_20;
  
  local_38 = *(undefined8 *)this;
  local_30 = "__contains__";
  local_28.super_handle.m_ptr = (handle)(PyObject *)0x0;
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::operator()
            ((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
              *)&local_20,&local_40);
  eVar1 = cast<bool>(&local_20);
  object::~object(&local_20);
  object::~object(&local_28);
  return eVar1;
}

Assistant:

bool object_api<D>::contains(T &&item) const {
    return attr("__contains__")(std::forward<T>(item)).template cast<bool>();
}